

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::DoubleToDecimalCast<float,short>
               (float input,short *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  double dVar1;
  short sVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uchar in_R8B;
  double dVar3;
  string error;
  allocator local_75;
  float local_74;
  Exception local_70 [2];
  string local_50;
  
  local_74 = input;
  dVar3 = round((double)input *
                *(double *)
                 (NumericHelper::DOUBLE_POWERS_OF_TEN +
                 (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  if (-dVar1 < dVar3 && dVar3 < dVar1) {
    sVar2 = Cast::Operation<float,short>((float)dVar3);
    *result = sVar2;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_70,"Could not cast value %f to DECIMAL(%d,%d)",&local_75);
    Exception::ConstructMessage<float,unsigned_char,unsigned_char>
              (&local_50,local_70,(string *)(ulong)width,local_74,scale,in_R8B);
    ::std::__cxx11::string::~string((string *)local_70);
    HandleCastError::AssignError(&local_50,parameters);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return -dVar1 < dVar3 && dVar3 < dVar1;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	// For some reason PG does not use statistical rounding here (even though it _does_ for integers...)
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(roundedValue));
	return true;
}